

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::HeapType::HeapType(HeapType *this,Struct *struct_)

{
  undefined2 *puVar1;
  HeapType HVar2;
  undefined8 local_28;
  
  puVar1 = (undefined2 *)operator_new(0x50);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 2) = 1;
  *(undefined8 *)(puVar1 + 4) = 0;
  *(undefined8 *)(puVar1 + 8) = 0;
  *(undefined8 *)(puVar1 + 0xc) = 0;
  *(undefined8 *)(puVar1 + 0x10) = 0;
  *(undefined8 *)(puVar1 + 0x14) = 0;
  *(undefined4 *)(puVar1 + 0x18) = 2;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)(puVar1 + 0x1c),&struct_->fields);
  local_28 = puVar1;
  HVar2 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)&stack0xffffffffffffffd8,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)struct_);
  this->id = (uintptr_t)HVar2;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

HeapType::HeapType(const Struct& struct_) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(struct_)));
}